

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssertPropertyStmt *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  PropertyAction PVar3;
  Property *pPVar4;
  Sequence *this_00;
  ostream *poVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view sVar7;
  string_view format_str;
  format_args args;
  code **local_d8;
  undefined8 uStack_d0;
  undefined1 auStack_c8 [8];
  EventControl edge;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined1 local_50 [8];
  string action;
  
  pPVar4 = stmt->property_;
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar7 = indent(this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar7._M_str,sVar7._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"property ",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(pPVar4->property_name_)._M_dataplus._M_p,
                      (pPVar4->property_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  auStack_c8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,auStack_c8,1);
  this->indent_ = this->indent_ + 1;
  auStack_c8 = (undefined1  [8])(pPVar4->edge_).delay;
  edge.delay = (uint64_t)(pPVar4->edge_).var;
  edge.var = *(Var **)&(pPVar4->edge_).type;
  edge.type = (pPVar4->edge_).delay_side;
  edge.edge = *(EventEdgeType *)&(pPVar4->edge_).field_0x1c;
  this_00 = (pPVar4->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((Var *)edge.delay != (Var *)0x0) {
    sVar7 = indent(this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar7._M_str,sVar7._M_len);
    edge._24_8_ = this;
    EventControl::to_string
              ((string *)&local_78,(EventControl *)auStack_c8,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
                *)&edge.delay_side);
    local_d8 = (code **)local_78._M_unused._0_8_;
    uStack_d0 = local_78._8_8_;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x7;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_d8;
    fmt::v7::detail::vformat_abi_cxx11_((string *)local_50,(detail *)"@({0}) ",format_str,args);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(char *)local_50,(long)action._M_dataplus._M_p);
    if (local_50 != (undefined1  [8])&action._M_string_length) {
      operator_delete((void *)local_50,
                      CONCAT71(action._M_string_length._1_7_,(undefined1)action._M_string_length) +
                      1);
    }
    if ((code **)local_78._M_unused._0_8_ != &local_68) {
      operator_delete(local_78._M_unused._M_object,(ulong)(local_68 + 1));
    }
    std::
    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:738:67)>
    ::_M_manager((_Any_data *)&edge.delay_side,(_Any_data *)&edge.delay_side,__destroy_functor);
  }
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:742:31)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:742:31)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  Sequence::to_string((string *)local_50,this_00,
                      (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
                       *)&local_78);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(char *)local_50,(long)action._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  edge.delay_side._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&edge.delay_side,1);
  if (local_50 != (undefined1  [8])&action._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(action._M_string_length._1_7_,(undefined1)action._M_string_length) + 1)
    ;
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  this->indent_ = this->indent_ - 1;
  sVar7 = indent(this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar7._M_str,sVar7._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"endproperty",0xb);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  local_50[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50,1);
  local_50 = (undefined1  [8])&action._M_string_length;
  action._M_dataplus._M_p = (pointer)0x0;
  action._M_string_length._0_1_ = 0;
  PVar3 = pPVar4->action_;
  if (PVar3 == Assert) {
    pcVar6 = "assert";
  }
  else if (PVar3 == Assume) {
    pcVar6 = "assume";
  }
  else {
    if (PVar3 != Cover) goto LAB_0020b0a3;
    pcVar6 = "cover";
  }
  std::__cxx11::string::_M_replace((ulong)local_50,0,(char *)0x0,(ulong)pcVar6);
  sVar7 = indent(this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar7._M_str,sVar7._M_len);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_50,(long)action._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," property (",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(pPVar4->property_name_)._M_dataplus._M_p,
                      (pPVar4->property_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  if ((stmt->else_stmt_).super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0 || PVar3 != Assert) {
    local_78._M_pod_data[0] = ';';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,local_78._M_pod_data,1);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    local_78._M_pod_data[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78._M_pod_data,1);
  }
  else {
    (**this->_vptr_SystemVerilogCodeGen)(this);
  }
LAB_0020b0a3:
  if (local_50 != (undefined1  [8])&action._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(action._M_string_length._1_7_,(undefined1)action._M_string_length) + 1)
    ;
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssertPropertyStmt* stmt) {
    auto* property = stmt->property();
    stream_ << indent() << "property " << property->property_name() << ";" << stream_.endl();
    increase_indent();
    auto edge = property->edge();
    auto* seq = property->sequence();
    if (edge.var) {
        stream_ << indent() << ::format("@({0}) ", edge.to_string([this](const Var* var) {
            return stream_.var_str(var);
        }));
    }
    stream_ << seq->to_string([this](Var* v) { return stream_.var_str(v); }) << ";"
            << stream_.endl();
    decrease_indent();
    stream_ << indent() << "endproperty" << stream_.endl();

    // put assert here
    std::string action;
    auto const action_type = property->action();
    if (action_type == PropertyAction::Assert)
        action = "assert";
    else if (action_type == PropertyAction::Assume)
        action = "assume";
    else if (action_type == PropertyAction::Cover)
        action = "cover";
    else
        return;
    stream_ << indent() << action << " property (" << property->property_name() << ")";
    if (stmt->else_() && action_type == PropertyAction::Assert) {
        dispatch_node(stmt->else_().get());
    } else {
        stream_ << ';' << stream_.endl();
    }
}